

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_LineEffect
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  byte *pbVar1;
  PClass *pPVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  char *pcVar7;
  undefined4 uVar8;
  AActor *activator;
  bool bVar9;
  maplinedef_t oldjunk;
  line_t_conflict junk;
  PClass *pPVar6;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
    goto LAB_003dcdb8;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003dcda8:
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003dcdb8:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x149b,
                  "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  activator = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (activator == (AActor *)0x0) goto LAB_003dcc90;
    pPVar6 = (activator->super_DThinker).super_DObject.Class;
    if (pPVar6 == (PClass *)0x0) {
      iVar4 = (**(activator->super_DThinker).super_DObject._vptr_DObject)(activator);
      pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
      (activator->super_DThinker).super_DObject.Class = pPVar6;
    }
    bVar9 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar2 && bVar9) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar2) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if (!bVar9) {
      pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003dcdb8;
    }
  }
  else {
    if (activator != (AActor *)0x0) goto LAB_003dcda8;
LAB_003dcc90:
    activator = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dce3d:
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x149c,
                    "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    sVar3 = (short)param[1].field_0.i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar7 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003dce3d;
    }
    sVar3 = (short)param[1].field_0.i;
    if (2 < numparam) {
      if (param[2].field_0.field_3.Type != '\0') {
        pcVar7 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_003dcdd7;
      }
      goto LAB_003dcce5;
    }
    param = defaultparam->Array;
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dcdd7:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x149d,
                  "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_003dcce5:
  iVar4 = 0;
  uVar8 = 0;
  if (((activator->flags6).Value & 0x8000) == 0) {
    uVar8 = 0;
    oldjunk.special = sVar3;
    if (sVar3 != 0) {
      oldjunk.tag = (short)param[2].field_0.i;
      P_TranslateLineDef((line_t *)&junk,&oldjunk,-1);
      uVar8 = 0;
      iVar5 = P_ExecuteSpecial(junk.special,(line_t *)0x0,activator,false,junk.args[0],junk.args[1],
                               junk.args[2],junk.args[3],junk.args[4]);
      if ((iVar5 != 0) && (uVar8 = 1, (junk.flags._1_1_ & 2) == 0)) {
        pbVar1 = (byte *)((long)&(activator->flags6).Value + 1);
        *pbVar1 = *pbVar1 | 0x80;
      }
    }
  }
  if (0 < numret) {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x14ae,
                    "int AF_AActor_A_LineEffect(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (ret->RegType != '\0') {
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
    *(undefined4 *)ret->Location = uVar8;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LineEffect)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(special);
	PARAM_INT_DEF(tag);

	line_t junk;
	maplinedef_t oldjunk;
	bool res = false;
	if (!(self->flags6 & MF6_LINEDONE))						// Unless already used up
	{
		if ((oldjunk.special = special))					// Linedef type
		{
			oldjunk.tag = tag;								// Sector tag for linedef
			P_TranslateLineDef(&junk, &oldjunk);			// Turn into native type
			res = !!P_ExecuteSpecial(junk.special, NULL, self, false, junk.args[0], 
				junk.args[1], junk.args[2], junk.args[3], junk.args[4]); 
			if (res && !(junk.flags & ML_REPEAT_SPECIAL))	// If only once,
				self->flags6 |= MF6_LINEDONE;				// no more for this thing
		}
	}
	ACTION_RETURN_BOOL(res);
}